

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControl::processEvent
          (QWidgetTextControl *this,QEvent *e,QPointF *coordinateOffset,QWidget *contextWidget)

{
  qreal qVar1;
  undefined8 in_RCX;
  QPointF *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QTransform t;
  QTransform *in_stack_ffffffffffffff70;
  qreal qVar2;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xffffffffffffffff;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = 0xffffffffffffffff;
  uStack_20 = 0xffffffffffffffff;
  local_38 = 0xffffffffffffffff;
  uStack_30 = 0xffffffffffffffff;
  local_48 = 0xffffffffffffffff;
  uStack_40 = 0xffffffffffffffff;
  local_58 = 0xffffffffffffffff;
  uStack_50 = 0xffffffffffffffff;
  QTransform::QTransform(in_stack_ffffffffffffff70);
  qVar2 = QPointF::x(in_RDX);
  qVar1 = QPointF::y(in_RDX);
  QTransform::translate(qVar2,qVar1);
  (**(code **)(*in_RDI + 0x88))(in_RDI,in_RSI,&local_58,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::processEvent(QEvent *e, const QPointF &coordinateOffset, QWidget *contextWidget)
{
    QTransform t;
    t.translate(coordinateOffset.x(), coordinateOffset.y());
    processEvent(e, t, contextWidget);
}